

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Catch * __thiscall Catch::toString_abi_cxx11_(Catch *this,bool value)

{
  char *pcVar1;
  allocator local_12;
  undefined1 local_11;
  Catch *pCStack_10;
  bool value_local;
  
  pcVar1 = "false";
  if (value) {
    pcVar1 = "true";
  }
  local_11 = value;
  pCStack_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,pcVar1,&local_12);
  std::allocator<char>::~allocator((allocator<char> *)&local_12);
  return this;
}

Assistant:

std::string toString( bool value ) {
    return value ? "true" : "false";
}